

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::start_note(Renderer *this,int chan,int note,int vel)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint note_00;
  double dVar5;
  double dVar6;
  double diff;
  Sample *closest;
  double want_note;
  double cdiff;
  float f;
  int i;
  int prog;
  int bank;
  Sample *sp;
  Instrument *ip;
  int vel_local;
  int note_local;
  int chan_local;
  Renderer *this_local;
  
  iVar1 = this->channel[chan].bank;
  iVar2 = this->channel[chan].program;
  note_00 = note & 0x7f;
  if ((this->drumchannels & 1 << ((byte)chan & 0x1f)) == 0) {
    if (this->channel[chan].program == -1) {
      sp = (Sample *)this->default_instrument;
    }
    else if ((((&tonebank)[iVar1] == 0) ||
             (sp = *(Sample **)((&tonebank)[iVar1] + 8 + (long)iVar2 * 8), sp == (Sample *)0x0)) &&
            (sp = *(Sample **)(tonebank + 8 + (long)iVar2 * 8), sp == (Sample *)0x0)) {
      return;
    }
    if (sp == (Sample *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/playmidi.cpp"
                    ,0x175,"void Timidity::Renderer::start_note(int, int, int)");
    }
    if (sp == (Sample *)0xffffffffffffffff) {
      return;
    }
  }
  else {
    if ((((&drumset)[iVar1] == 0) ||
        (sp = *(Sample **)((&drumset)[iVar1] + 8 + (long)(int)note_00 * 8), sp == (Sample *)0x0)) &&
       (sp = *(Sample **)(drumset + 8 + (long)(int)note_00 * 8), sp == (Sample *)0x0)) {
      return;
    }
    if (sp == (Sample *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/playmidi.cpp"
                    ,0x15f,"void Timidity::Renderer::start_note(int, int, int)");
    }
    if (sp == (Sample *)0xffffffffffffffff) {
      return;
    }
    if ((sp->loop_start != 1) && (*(char *)(*(long *)&sp->data_length + 0x44) == '\0')) {
      cmsg(1,1,"Strange: percussion instrument with %d samples!",(ulong)(uint)sp->loop_start);
    }
  }
  lVar3._0_4_ = sp->data_length;
  lVar3._4_4_ = sp->sample_rate;
  if ((lVar3 != 0) && (sp->loop_start != 0)) {
    if ((*(char *)(*(long *)&sp->data_length + 0x44) == '\0') &&
       (*(short *)(*(long *)&sp->data_length + 0x4a) != 0x400)) {
      cdiff._0_4_ = calculate_scaled_frequency(this,*(Sample **)&sp->data_length,note_00);
    }
    else {
      dVar5 = pow(2.0,(double)note_00 / 12.0);
      cdiff._0_4_ = (float)(dVar5 * 8175.798947309669);
    }
    if (*(char *)(*(long *)&sp->data_length + 0x44) == '\0') {
      if (sp->loop_start == 1) {
        start_region(this,chan,note_00,vel,*(Sample **)&sp->data_length,cdiff._0_4_);
      }
      _prog = *(Sample **)&sp->data_length;
      for (cdiff._4_4_ = sp->loop_start; cdiff._4_4_ != 0; cdiff._4_4_ = cdiff._4_4_ + -1) {
        if (((_prog->low_freq <= cdiff._0_4_) && (cdiff._0_4_ <= _prog->high_freq)) &&
           ((cdiff._4_4_ < 2 ||
            ((cdiff._0_4_ < _prog[1].low_freq || (_prog[1].high_freq < cdiff._0_4_)))))) {
          start_region(this,chan,note_00,vel,_prog,cdiff._0_4_);
          break;
        }
        _prog = _prog + 1;
      }
      if (cdiff._4_4_ == 0) {
        want_note = 10000000000.0;
        dVar5 = log((double)cdiff._0_4_ / 8175.798947309669);
        diff = *(double *)&sp->data_length;
        _prog = (Sample *)diff;
        for (cdiff._4_4_ = sp->loop_start; cdiff._4_4_ != 0; cdiff._4_4_ = cdiff._4_4_ + -1) {
          dVar6 = log((double)*(float *)((long)_prog + 0x18) / 8175.798947309669);
          dVar6 = ABS(dVar6 * 17.312340490667562 - dVar5 * 17.312340490667562);
          if (dVar6 < want_note) {
            diff = (double)_prog;
            want_note = dVar6;
          }
          _prog = (Sample *)((long)_prog + 0x68);
        }
        start_region(this,chan,note_00,vel,(Sample *)diff,cdiff._0_4_);
      }
    }
    else {
      cdiff._4_4_ = sp->loop_start;
      _prog = *(Sample **)&sp->data_length;
      while ((cdiff._4_4_ != 0 &&
             ((((vel < (int)(uint)_prog->low_vel || ((int)(uint)_prog->high_vel < vel)) ||
               (cdiff._0_4_ < _prog->low_freq)) ||
              ((_prog->high_freq < cdiff._0_4_ ||
               (bVar4 = start_region(this,chan,note_00,vel,_prog,cdiff._0_4_), bVar4))))))) {
        cdiff._4_4_ = cdiff._4_4_ + -1;
        _prog = _prog + 1;
      }
    }
  }
  return;
}

Assistant:

void Renderer::start_note(int chan, int note, int vel)
{
	Instrument *ip;
	Sample *sp;
	int bank = channel[chan].bank;
	int prog = channel[chan].program;
	int i;
	float f;

	note &= 0x7f;
	if (ISDRUMCHANNEL(chan))
	{
		if (NULL == drumset[bank] || NULL == (ip = drumset[bank]->instrument[note]))
		{
			if (!(ip = drumset[0]->instrument[note]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
		if (ip->samples != 1 && ip->sample->type == INST_GUS)
		{
			cmsg(CMSG_WARNING, VERB_VERBOSE, 
				"Strange: percussion instrument with %d samples!", ip->samples);
		}
	}
	else
	{
		if (channel[chan].program == SPECIAL_PROGRAM)
		{
			ip = default_instrument;
		}
		else if (NULL == tonebank[bank] || NULL == (ip = tonebank[bank]->instrument[prog]))
		{
			if (NULL == (ip = tonebank[0]->instrument[prog]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
	}

	if (NULL == ip->sample || ip->samples == 0)
		return;	/* No samples? Then nothing to play. */

	// For GF1 patches, scaling is based solely on the first
	// waveform in this layer.
	if (ip->sample->type == INST_GUS && ip->sample->scale_factor != 1024)
	{
		f = calculate_scaled_frequency(ip->sample, note);
	}
	else
	{
		f = note_to_freq(note);
	}

	if (ip->sample->type == INST_GUS)
	{
		/* We're more lenient with matching ranges for GUS patches, since the
		 * official Gravis ones don't cover the full range of possible
		 * frequencies for every instrument.
		 */
		if (ip->samples == 1)
		{ // If there's only one sample, definitely play it.
			start_region(chan, note, vel, ip->sample, f);
		}
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			// GUS patches don't have velocity ranges, so no need to compare against them.
			if (sp->low_freq <= f && sp->high_freq >= f)
			{
				if (i > 1 && (sp + 1)->low_freq <= f && (sp + 1)->high_freq >= f)
				{ /* If there is a range of contiguous regions that match our
				   * desired frequency, the last one in that block is used.
				   */
					continue;
				}
				start_region(chan, note, vel, sp, f);
				break;
			}
		}
		if (i == 0)
		{ /* Found nothing. Try again, but look for the one with the closest root frequency.
		   * As per the suggestion in the original TiMidity function, this search uses
		   * note values rather than raw frequencies.
		   */
			double cdiff = 1e10;
			double want_note = freq_to_note(f);
			Sample *closest = sp = ip->sample;
			for (i = ip->samples; i != 0; --i, ++sp)
			{
				double diff = fabs(freq_to_note(sp->root_freq) - want_note);
				if (diff < cdiff)
				{
					cdiff = diff;
					closest = sp;
				}
			}
			start_region(chan, note, vel, closest, f);
		}
	}
	else
	{
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			if ((sp->low_vel <= vel && sp->high_vel >= vel &&
				 sp->low_freq <= f && sp->high_freq >= f))
			{
				if (!start_region(chan, note, vel, sp, f))
				{ // Ran out of voices
					break;
				}
			}
		}
	}
}